

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::IsKeyDown(int user_key_index)

{
  bool local_19;
  ImGuiContext *g;
  int user_key_index_local;
  
  if (user_key_index < 0) {
    g._7_1_ = false;
  }
  else {
    local_19 = 0x1ff < (uint)user_key_index;
    if (local_19) {
      __assert_fail("user_key_index >= 0 && user_key_index < ((int)(sizeof(g.IO.KeysDown) / sizeof(*(g.IO.KeysDown))))"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/imgui/imgui.cpp"
                    ,0x121f,"bool ImGui::IsKeyDown(int)");
    }
    g._7_1_ = (bool)((GImGui->IO).KeysDown[user_key_index] & 1);
  }
  return g._7_1_;
}

Assistant:

bool ImGui::IsKeyDown(int user_key_index)
{
    if (user_key_index < 0)
        return false;
    ImGuiContext& g = *GImGui;
    IM_ASSERT(user_key_index >= 0 && user_key_index < IM_ARRAYSIZE(g.IO.KeysDown));
    return g.IO.KeysDown[user_key_index];
}